

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr_conflict define)

{
  int iVar1;
  ushort uVar2;
  xmlRelaxNGDefinePtr pxVar3;
  
  if (define == (xmlRelaxNGDefinePtr_conflict)0x0) {
switchD_001877ec_caseD_e:
    return -1;
  }
  uVar2 = define->dflags;
  if ((uVar2 & 1) != 0) {
    return 1;
  }
  if ((uVar2 & 2) != 0) {
    return 0;
  }
  iVar1 = -1;
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
  case XML_RELAXNG_TEXT:
    goto switchD_001877ec_caseD_0;
  case XML_RELAXNG_OPTIONAL:
  case XML_RELAXNG_ZEROORMORE:
    goto switchD_001877ec_caseD_e;
  case XML_RELAXNG_CHOICE:
    for (pxVar3 = define->content; pxVar3 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar3 = pxVar3->next) {
      iVar1 = xmlRelaxNGIsNullable(pxVar3);
      if (iVar1 != 0) goto LAB_001877f7;
    }
  case XML_RELAXNG_NOT_ALLOWED:
  case XML_RELAXNG_EXCEPT:
  case XML_RELAXNG_ELEMENT:
  case XML_RELAXNG_DATATYPE:
  case XML_RELAXNG_PARAM:
  case XML_RELAXNG_VALUE:
  case XML_RELAXNG_LIST:
  case XML_RELAXNG_ATTRIBUTE:
switchD_001877ec_caseD_1:
    uVar2 = define->dflags | 2;
    iVar1 = 0;
    break;
  case XML_RELAXNG_GROUP:
  case XML_RELAXNG_INTERLEAVE:
  case XML_RELAXNG_START:
    pxVar3 = define->content;
    while( true ) {
      if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 1;
      }
      iVar1 = xmlRelaxNGIsNullable(pxVar3);
      if (iVar1 != 1) break;
      pxVar3 = pxVar3->next;
    }
LAB_001877f7:
    if (iVar1 == 0) goto switchD_001877ec_caseD_1;
    if (iVar1 != 1) {
      return iVar1;
    }
    uVar2 = define->dflags;
switchD_001877ec_caseD_0:
    uVar2 = uVar2 | 1;
    iVar1 = 1;
    break;
  case XML_RELAXNG_NOOP:
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_REF:
  case XML_RELAXNG_EXTERNALREF:
  case XML_RELAXNG_PARENTREF:
  case XML_RELAXNG_ONEORMORE:
    iVar1 = xmlRelaxNGIsNullable(define->content);
    goto LAB_001877f7;
  default:
    goto switchD_001877ec_caseD_e;
  }
  define->dflags = uVar2;
switchD_001877ec_caseD_e:
  return iVar1;
}

Assistant:

static int
xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr define)
{
    int ret;

    if (define == NULL)
        return (-1);

    if (define->dflags & IS_NULLABLE)
        return (1);
    if (define->dflags & IS_NOT_NULLABLE)
        return (0);
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
        case XML_RELAXNG_TEXT:
            ret = 1;
            break;
        case XML_RELAXNG_NOOP:
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGIsNullable(define->content);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_ELEMENT:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_ATTRIBUTE:
            ret = 0;
            break;
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 0)
                        goto done;
                    list = list->next;
                }
                ret = 0;
                break;
            }
        case XML_RELAXNG_START:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 1)
                        goto done;
                    list = list->next;
                }
                return (1);
            }
        default:
            return (-1);
    }
  done:
    if (ret == 0)
        define->dflags |= IS_NOT_NULLABLE;
    if (ret == 1)
        define->dflags |= IS_NULLABLE;
    return (ret);
}